

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes_llvm_builtins.cpp
# Opt level: O3

bool dxil_spv::emit_shufflevector_instruction(Impl *impl,ShuffleVectorInst *inst)

{
  Id IVar1;
  uint uVar2;
  uint32_t lit;
  Operation *this;
  Value *pVVar3;
  Type *this_00;
  uint index;
  
  this = Converter::Impl::allocate(impl,OpVectorShuffle,(Value *)inst);
  index = 0;
  pVVar3 = LLVMBC::Instruction::getOperand(&inst->super_Instruction,0);
  IVar1 = Converter::Impl::get_id_for_value(impl,pVVar3,0);
  Operation::add_id(this,IVar1);
  pVVar3 = LLVMBC::Instruction::getOperand(&inst->super_Instruction,1);
  IVar1 = Converter::Impl::get_id_for_value(impl,pVVar3,0);
  Operation::add_id(this,IVar1);
  this_00 = LLVMBC::Value::getType((Value *)inst);
  uVar2 = LLVMBC::Type::getVectorNumElements(this_00);
  if (uVar2 != 0) {
    do {
      lit = LLVMBC::ShuffleVectorInst::getMaskValue(inst,index);
      Operation::add_literal(this,lit);
      index = index + 1;
    } while (uVar2 != index);
  }
  Converter::Impl::add(impl,this,false);
  return true;
}

Assistant:

bool emit_shufflevector_instruction(Converter::Impl &impl, const llvm::ShuffleVectorInst *inst)
{
	Operation *op = impl.allocate(spv::OpVectorShuffle, inst);

	for (unsigned i = 0; i < 2; i++)
		op->add_id(impl.get_id_for_value(inst->getOperand(i)));

	unsigned num_outputs = inst->getType()->getVectorNumElements();
	for (unsigned i = 0; i < num_outputs; i++)
		op->add_literal(inst->getMaskValue(i));

	impl.add(op);
	return true;
}